

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void platform_call_wrapper
               (void *ptr,StackFrame **arguments,size_t argcount,size_t outsize,bool varargs,VM *vm)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t local_50;
  size_t retval;
  size_t i;
  int64_t *args;
  VM *vm_local;
  size_t sStack_28;
  bool varargs_local;
  size_t outsize_local;
  size_t argcount_local;
  StackFrame **arguments_local;
  void *ptr_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = argcount;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  args = (int64_t *)vm;
  vm_local._7_1_ = varargs;
  sStack_28 = outsize;
  outsize_local = argcount;
  argcount_local = (size_t)arguments;
  arguments_local = (StackFrame **)ptr;
  i = (size_t)operator_new__(uVar2);
  for (retval = 0; retval < outsize_local; retval = retval + 1) {
    memcpy((void *)(i + retval * 8),(void *)**(undefined8 **)(argcount_local + retval * 8),
           *(size_t *)(*(long *)(argcount_local + retval * 8) + 8));
  }
  local_50 = x86_call_wrapper(arguments_local,(int64_t *)i,outsize_local,sStack_28,
                              (bool)(vm_local._7_1_ & 1));
  if (sStack_28 != 0) {
    VM::push((VM *)args,&local_50,sStack_28);
  }
  if (i != 0) {
    operator_delete__((void *)i);
  }
  return;
}

Assistant:

void platform_call_wrapper(void* ptr, StackFrame** arguments, size_t argcount, size_t outsize, bool varargs, VM* vm) {
  int64_t* args = new int64_t[argcount];
  for(size_t i = 0;i<argcount;i++) {
    memcpy(args+i,arguments[i]->ptr,arguments[i]->size);
  }
  size_t retval = x86_call_wrapper(ptr,args,argcount,outsize,varargs);
  if(outsize) {
    vm->push(&retval,outsize);
  }
  delete[] args;
}